

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O1

int lstrlenW(LPCWSTR lpString)

{
  long lVar1;
  long lVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    lVar2 = 0;
    if ((lpString != (LPCWSTR)0x0) && (*lpString != L'\0')) {
      lVar2 = 0;
      do {
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (lpString[lVar1] != L'\0');
    }
    return (int)lVar2;
  }
  abort();
}

Assistant:

int
PALAPI
lstrlenW(
	 IN LPCWSTR lpString)
{
    int nChar = 0;

    PERF_ENTRY(lstrlenW);
    ENTRY("lstrlenW (lpString=%p (%S))\n", lpString?lpString:W16_NULLSTRING, lpString?lpString:W16_NULLSTRING);
    if (lpString != NULL)
    {
        while (*lpString++)
        {
            nChar++;      
        }
    }
    LOGEXIT("lstrlenW returning int %d\n", nChar);
    PERF_EXIT(lstrlenW);
    return nChar;
}